

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_entropy.c
# Opt level: O2

double inform_block_entropy(int *series,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  _Bool _Var1;
  uint32_t *__ptr;
  size_t sVar2;
  int iVar3;
  ulong __nmemb;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  size_t j_1;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  inform_dist states;
  
  _Var1 = check_arguments(series,n,m,b,k,err);
  dVar9 = NAN;
  if (!_Var1) {
    auVar10._8_4_ = (int)(k >> 0x20);
    auVar10._0_8_ = k;
    auVar10._12_4_ = 0x45300000;
    dVar9 = pow((double)b,
                (auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    __nmemb = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
    __ptr = (uint32_t *)calloc(__nmemb,4);
    if (__ptr == (uint32_t *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      dVar9 = NAN;
    }
    else {
      states.counts = ((m - k) + 1) * n;
      for (sVar2 = 0; sVar2 != n; sVar2 = sVar2 + 1) {
        iVar3 = 0;
        iVar5 = 1;
        for (uVar6 = 0; piVar7 = series, uVar8 = k - 1, k - 1 != uVar6; uVar6 = uVar6 + 1) {
          iVar5 = iVar5 * b;
          iVar3 = iVar3 * b + series[uVar6];
        }
        for (; uVar8 < m; uVar8 = uVar8 + 1) {
          lVar4 = (long)(iVar3 * b) + (long)piVar7[k - 1];
          __ptr[lVar4] = __ptr[lVar4] + 1;
          iVar3 = (int)lVar4 - *piVar7 * iVar5;
          piVar7 = piVar7 + 1;
        }
        series = series + m;
      }
      states.histogram = __ptr;
      states.size = __nmemb;
      dVar9 = inform_shannon_entropy(&states,2.0);
      free(__ptr);
    }
  }
  return dVar9;
}

Assistant:

double inform_block_entropy(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NAN;

    size_t const states_size = (size_t) pow((double) b, (double) k);

    uint32_t *data = calloc(states_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    size_t const N = n * (m - k + 1);

    inform_dist states = { data, states_size, N };

    accumulate_observations(series, n, m, b, k, &states);

    double be = inform_shannon_entropy(&states, 2.0);

    free(data);

    return be;
}